

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarmonicTorsionType.hpp
# Opt level: O0

ostream * OpenMD::operator<<(ostream *os,HarmonicTorsionType *htt)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"This HarmonicTorsionType has below form:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*(double *)(in_RSI + 8));
  poVar1 = std::operator<<(poVar1,"*(phi - ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RSI + 0x10));
  poVar1 = std::operator<<(poVar1,")/2");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, HarmonicTorsionType& htt) {
    os << "This HarmonicTorsionType has below form:" << std::endl;
    os << htt.d0_ << "*(phi - " << htt.phi0_ << ")/2" << std::endl;
    return os;
  }